

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::LongNameHandler::simpleFormatsToModifiers
          (LongNameHandler *this,UnicodeString *simpleFormats,Field field,UErrorCode *status)

{
  long lVar1;
  SimpleModifier *this_00;
  Parameters local_138;
  UnicodeString simpleFormat;
  SimpleFormatter compiledFormatter;
  SimpleModifier local_a0;
  
  this_00 = (SimpleModifier *)&this->field_0x10;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 6) {
      return;
    }
    anon_unknown.dwarf_178d38::getWithPlural(&simpleFormat,simpleFormats,(Form)lVar1,status);
    if (U_ZERO_ERROR < *status) break;
    SimpleFormatter::SimpleFormatter(&compiledFormatter,&simpleFormat,0,1,status);
    if (U_ZERO_ERROR < *status) {
      SimpleFormatter::~SimpleFormatter(&compiledFormatter);
      break;
    }
    Modifier::Parameters::Parameters(&local_138,&this->super_ModifierStore,'\0',(Form)lVar1);
    SimpleModifier::SimpleModifier(&local_a0,&compiledFormatter,field,false,local_138);
    SimpleModifier::operator=(this_00,&local_a0);
    SimpleModifier::~SimpleModifier(&local_a0);
    SimpleFormatter::~SimpleFormatter(&compiledFormatter);
    UnicodeString::~UnicodeString(&simpleFormat);
    lVar1 = lVar1 + 1;
    this_00 = this_00 + 1;
  }
  UnicodeString::~UnicodeString(&simpleFormat);
  return;
}

Assistant:

void LongNameHandler::simpleFormatsToModifiers(const UnicodeString *simpleFormats, Field field,
                                               UErrorCode &status) {
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        StandardPlural::Form plural = static_cast<StandardPlural::Form>(i);
        UnicodeString simpleFormat = getWithPlural(simpleFormats, plural, status);
        if (U_FAILURE(status)) { return; }
        SimpleFormatter compiledFormatter(simpleFormat, 0, 1, status);
        if (U_FAILURE(status)) { return; }
        fModifiers[i] = SimpleModifier(compiledFormatter, field, false, {this, 0, plural});
    }
}